

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void QtPromisePrivate::PromiseDispatch<float>::
     call<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>,float(*)(float),float_const&>
               (QPromiseResolve<float> *resolve,QPromiseReject<float> *reject,_func_float_float *fn,
               float *args)

{
  float local_14;
  
  local_14 = (*fn)(*args);
  PromiseResolver<float>::resolve<float>(&resolve->m_resolver,&local_14);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }